

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void * build_ir_internal(Context_conflict *ctx,void *_ast)

{
  int label_00;
  MOJOSHADER_astDataTypeType type_00;
  int elements;
  MOJOSHADER_irExpression *pMVar1;
  MOJOSHADER_irExpression *pMVar2;
  MOJOSHADER_irStatement *pMVar3;
  MOJOSHADER_astDataType *dt_00;
  MOJOSHADER_astDataType *pMVar4;
  MOJOSHADER_irExpression *pMVar5;
  MOJOSHADER_irExpression *pMVar6;
  MOJOSHADER_irStatement *pMVar7;
  int elems;
  MOJOSHADER_astDataTypeType type;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_irStatement *retval;
  int label;
  LoopLabels *labels_1;
  LoopLabels *labels;
  MOJOSHADER_astNode *ast;
  void *_ast_local;
  Context_conflict *ctx_local;
  
  if ((_ast == (void *)0x0) || (ctx->out_of_memory != 0)) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    ctx->sourcefile = *(char **)((long)_ast + 8);
    ctx->sourceline = *(uint *)((long)_ast + 0x10);
    switch(*_ast) {
    case 2:
      ctx_local = (Context_conflict *)
                  build_ir_preincdec(ctx,(MOJOSHADER_astExpressionUnary *)_ast,
                                     MOJOSHADER_IR_BINOP_ADD);
      break;
    case 3:
      ctx_local = (Context_conflict *)
                  build_ir_preincdec(ctx,(MOJOSHADER_astExpressionUnary *)_ast,
                                     MOJOSHADER_IR_BINOP_SUBTRACT);
      break;
    case 4:
      pMVar5 = build_ir_increxpr(ctx,*(MOJOSHADER_astDataType **)((long)_ast + 0x18),-1);
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_SUBTRACT,pMVar5,pMVar6);
      break;
    case 5:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = new_ir_constint(ctx,-1);
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_XOR,pMVar5,pMVar6);
      break;
    case 6:
      if (**(int **)(*(long *)((long)_ast + 0x20) + 0x18) != 1) {
        __assert_fail("ast->unary.operand->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x155b,"void *build_ir_internal(Context *, void *)");
      }
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = new_ir_constint(ctx,1);
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_XOR,pMVar5,pMVar6);
      break;
    case 7:
      ctx_local = (Context_conflict *)
                  build_ir_postincdec(ctx,(MOJOSHADER_astExpressionUnary *)_ast,
                                      MOJOSHADER_IR_BINOP_ADD);
      break;
    case 8:
      ctx_local = (Context_conflict *)
                  build_ir_postincdec(ctx,(MOJOSHADER_astExpressionUnary *)_ast,
                                      MOJOSHADER_IR_BINOP_SUBTRACT);
      break;
    case 9:
      ctx_local = (Context_conflict *)build_ir_convert(ctx,(MOJOSHADER_astExpressionCast *)_ast);
      break;
    default:
      __assert_fail("0 && \"unexpected type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1607,"void *build_ir_internal(Context *, void *)");
    case 0xc:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar7 = new_ir_expr_stmt(ctx,pMVar5);
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      ctx_local = (Context_conflict *)new_ir_eseq(ctx,pMVar7,pMVar5);
      break;
    case 0xd:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_MULTIPLY,pMVar5,pMVar6);
      break;
    case 0xe:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_DIVIDE,pMVar5,pMVar6);
      break;
    case 0xf:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_MODULO,pMVar5,pMVar6);
      break;
    case 0x10:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_ADD,pMVar5,pMVar6);
      break;
    case 0x11:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_SUBTRACT,pMVar5,pMVar6);
      break;
    case 0x12:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_LSHIFT,pMVar5,pMVar6);
      break;
    case 0x13:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_RSHIFT,pMVar5,pMVar6);
      break;
    case 0x14:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      pMVar1 = new_ir_constbool(ctx,1);
      pMVar2 = new_ir_constbool(ctx,0);
      ctx_local = (Context_conflict *)
                  build_ir_compare(ctx,MOJOSHADER_IR_COND_LT,pMVar5,pMVar6,pMVar1,pMVar2);
      break;
    case 0x15:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      pMVar1 = new_ir_constbool(ctx,1);
      pMVar2 = new_ir_constbool(ctx,0);
      ctx_local = (Context_conflict *)
                  build_ir_compare(ctx,MOJOSHADER_IR_COND_GT,pMVar5,pMVar6,pMVar1,pMVar2);
      break;
    case 0x16:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      pMVar1 = new_ir_constbool(ctx,1);
      pMVar2 = new_ir_constbool(ctx,0);
      ctx_local = (Context_conflict *)
                  build_ir_compare(ctx,MOJOSHADER_IR_COND_LEQ,pMVar5,pMVar6,pMVar1,pMVar2);
      break;
    case 0x17:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      pMVar1 = new_ir_constbool(ctx,1);
      pMVar2 = new_ir_constbool(ctx,0);
      ctx_local = (Context_conflict *)
                  build_ir_compare(ctx,MOJOSHADER_IR_COND_GEQ,pMVar5,pMVar6,pMVar1,pMVar2);
      break;
    case 0x18:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      pMVar1 = new_ir_constbool(ctx,1);
      pMVar2 = new_ir_constbool(ctx,0);
      ctx_local = (Context_conflict *)
                  build_ir_compare(ctx,MOJOSHADER_IR_COND_EQL,pMVar5,pMVar6,pMVar1,pMVar2);
      break;
    case 0x19:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      pMVar1 = new_ir_constbool(ctx,1);
      pMVar2 = new_ir_constbool(ctx,0);
      ctx_local = (Context_conflict *)
                  build_ir_compare(ctx,MOJOSHADER_IR_COND_NEQ,pMVar5,pMVar6,pMVar1,pMVar2);
      break;
    case 0x1a:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_AND,pMVar5,pMVar6);
      break;
    case 0x1b:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_XOR,pMVar5,pMVar6);
      break;
    case 0x1c:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      ctx_local = (Context_conflict *)new_ir_binop(ctx,MOJOSHADER_IR_BINOP_OR,pMVar5,pMVar6);
      break;
    case 0x1d:
      ctx_local = (Context_conflict *)
                  build_ir_logical_and(ctx,(MOJOSHADER_astExpressionBinary *)_ast);
      break;
    case 0x1e:
      ctx_local = (Context_conflict *)
                  build_ir_logical_or(ctx,(MOJOSHADER_astExpressionBinary *)_ast);
      break;
    case 0x1f:
      ctx_local = (Context_conflict *)build_ir_assign(ctx,(MOJOSHADER_astExpressionBinary *)_ast);
      break;
    case 0x20:
      ctx_local = (Context_conflict *)
                  build_ir_assign_binop
                            (ctx,MOJOSHADER_IR_BINOP_MULTIPLY,(MOJOSHADER_astExpressionBinary *)_ast
                            );
      break;
    case 0x21:
      ctx_local = (Context_conflict *)
                  build_ir_assign_binop
                            (ctx,MOJOSHADER_IR_BINOP_DIVIDE,(MOJOSHADER_astExpressionBinary *)_ast);
      break;
    case 0x22:
      ctx_local = (Context_conflict *)
                  build_ir_assign_binop
                            (ctx,MOJOSHADER_IR_BINOP_MODULO,(MOJOSHADER_astExpressionBinary *)_ast);
      break;
    case 0x23:
      ctx_local = (Context_conflict *)
                  build_ir_assign_binop
                            (ctx,MOJOSHADER_IR_BINOP_ADD,(MOJOSHADER_astExpressionBinary *)_ast);
      break;
    case 0x24:
      ctx_local = (Context_conflict *)
                  build_ir_assign_binop
                            (ctx,MOJOSHADER_IR_BINOP_SUBTRACT,(MOJOSHADER_astExpressionBinary *)_ast
                            );
      break;
    case 0x25:
      ctx_local = (Context_conflict *)
                  build_ir_assign_binop
                            (ctx,MOJOSHADER_IR_BINOP_LSHIFT,(MOJOSHADER_astExpressionBinary *)_ast);
      break;
    case 0x26:
      ctx_local = (Context_conflict *)
                  build_ir_assign_binop
                            (ctx,MOJOSHADER_IR_BINOP_RSHIFT,(MOJOSHADER_astExpressionBinary *)_ast);
      break;
    case 0x27:
      ctx_local = (Context_conflict *)
                  build_ir_assign_binop
                            (ctx,MOJOSHADER_IR_BINOP_AND,(MOJOSHADER_astExpressionBinary *)_ast);
      break;
    case 0x28:
      ctx_local = (Context_conflict *)
                  build_ir_assign_binop
                            (ctx,MOJOSHADER_IR_BINOP_XOR,(MOJOSHADER_astExpressionBinary *)_ast);
      break;
    case 0x29:
      ctx_local = (Context_conflict *)
                  build_ir_assign_binop
                            (ctx,MOJOSHADER_IR_BINOP_OR,(MOJOSHADER_astExpressionBinary *)_ast);
      break;
    case 0x2a:
      ctx_local = (Context_conflict *)
                  build_ir_derefarray(ctx,(MOJOSHADER_astExpressionBinary *)_ast);
      break;
    case 0x2d:
      if (**(int **)(*(long *)((long)_ast + 0x20) + 0x18) != 1) {
        __assert_fail("ast->binary.left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1593,"void *build_ir_internal(Context *, void *)");
      }
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar6 = new_ir_constbool(ctx,1);
      pMVar1 = build_ir_expr(ctx,*(void **)((long)_ast + 0x28));
      pMVar2 = build_ir_expr(ctx,*(void **)((long)_ast + 0x30));
      ctx_local = (Context_conflict *)
                  build_ir_compare(ctx,MOJOSHADER_IR_COND_EQL,pMVar5,pMVar6,pMVar1,pMVar2);
      break;
    case 0x30:
      ctx_local = (Context_conflict *)
                  build_ir_identifier(ctx,(MOJOSHADER_astExpressionIdentifier *)_ast);
      break;
    case 0x31:
      ctx_local = (Context_conflict *)new_ir_constint(ctx,*(int *)((long)_ast + 0x20));
      break;
    case 0x32:
      ctx_local = (Context_conflict *)new_ir_constfloat(ctx,(float)*(double *)((long)_ast + 0x20));
      break;
    case 0x33:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
      __assert_fail("0 && \"Shouldn\'t hit this in build_ir.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1603,"void *build_ir_internal(Context *, void *)");
    case 0x34:
      ctx_local = (Context_conflict *)new_ir_constbool(ctx,*(int *)((long)_ast + 0x20));
      break;
    case 0x37:
      if (*(int *)((long)_ast + 0x30) == 0) {
        ctx_local = (Context_conflict *)
                    build_ir_derefstruct(ctx,(MOJOSHADER_astExpressionDerefStruct *)_ast);
      }
      else {
        ctx_local = (Context_conflict *)
                    build_ir_swizzle(ctx,(MOJOSHADER_astExpressionDerefStruct *)_ast);
      }
      break;
    case 0x38:
      ctx_local = (Context_conflict *)
                  build_ir_call(ctx,(MOJOSHADER_astExpressionCallFunction *)_ast);
      break;
    case 0x39:
      ctx_local = (Context_conflict *)
                  build_ir_constructor(ctx,(MOJOSHADER_astExpressionConstructor *)_ast);
      break;
    case 0x43:
      ctx_local = (Context_conflict *)build_ir(ctx,*(void **)((long)_ast + 0x18));
      break;
    case 0x44:
      if (ctx->ir_loop == (LoopLabels *)0x0) {
        __assert_fail("labels != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x15b2,"void *build_ir_internal(Context *, void *)");
      }
      ctx_local = (Context_conflict *)new_ir_jump(ctx,ctx->ir_loop->end);
      break;
    case 0x45:
      if (ctx->ir_loop == (LoopLabels *)0x0) {
        __assert_fail("labels != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x15b9,"void *build_ir_internal(Context *, void *)");
      }
      ctx_local = (Context_conflict *)new_ir_jump(ctx,ctx->ir_loop->start);
      break;
    case 0x46:
      pMVar7 = new_ir_discard(ctx);
      pMVar3 = build_ir_stmt(ctx,*(void **)((long)_ast + 0x18));
      ctx_local = (Context_conflict *)new_ir_seq(ctx,pMVar7,pMVar3);
      break;
    case 0x47:
      pMVar7 = build_ir_stmt(ctx,*(void **)((long)_ast + 0x20));
      pMVar3 = build_ir_stmt(ctx,*(void **)((long)_ast + 0x18));
      ctx_local = (Context_conflict *)new_ir_seq(ctx,pMVar7,pMVar3);
      break;
    case 0x48:
      pMVar5 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar7 = new_ir_expr_stmt(ctx,pMVar5);
      pMVar3 = build_ir_stmt(ctx,*(void **)((long)_ast + 0x18));
      ctx_local = (Context_conflict *)new_ir_seq(ctx,pMVar7,pMVar3);
      break;
    case 0x49:
      ctx_local = (Context_conflict *)build_ir_ifstmt(ctx,(MOJOSHADER_astIfStatement *)_ast);
      break;
    case 0x4a:
      ctx_local = (Context_conflict *)build_ir_switch(ctx,(MOJOSHADER_astSwitchStatement *)_ast);
      break;
    case 0x4b:
      ctx_local = (Context_conflict *)build_ir_forstmt(ctx,(MOJOSHADER_astForStatement *)_ast);
      break;
    case 0x4c:
      ctx_local = (Context_conflict *)build_ir_dostmt(ctx,(MOJOSHADER_astDoStatement *)_ast);
      break;
    case 0x4d:
      ctx_local = (Context_conflict *)build_ir_whilestmt(ctx,(MOJOSHADER_astWhileStatement *)_ast);
      break;
    case 0x4e:
      label_00 = ctx->ir_end;
      if (label_00 < 0) {
        __assert_fail("label >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x15e4,"void *build_ir_internal(Context *, void *)");
      }
      dt = (MOJOSHADER_astDataType *)0x0;
      if (*(long *)((long)_ast + 0x20) != 0) {
        dt_00 = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)
                                     (*(long *)((long)_ast + 0x20) + 0x18));
        pMVar4 = datatype_base(ctx,dt_00);
        type_00 = pMVar4->type;
        elements = datatype_elems(ctx,dt_00);
        if (ctx->ir_ret < 0) {
          __assert_fail("ctx->ir_ret >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x15ec,"void *build_ir_internal(Context *, void *)");
        }
        pMVar5 = new_ir_temp(ctx,ctx->ir_ret,type_00,elements);
        pMVar6 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
        dt = (MOJOSHADER_astDataType *)new_ir_move(ctx,pMVar5,pMVar6,-1);
      }
      pMVar7 = new_ir_jump(ctx,label_00);
      ctx_local = (Context_conflict *)new_ir_seq(ctx,(MOJOSHADER_irStatement *)dt,pMVar7);
      break;
    case 0x4f:
      ctx_local = (Context_conflict *)build_ir(ctx,*(void **)((long)_ast + 0x18));
      break;
    case 0x50:
      ctx_local = (Context_conflict *)build_ir(ctx,*(void **)((long)_ast + 0x18));
      break;
    case 0x51:
      ctx_local = (Context_conflict *)build_ir(ctx,*(void **)((long)_ast + 0x18));
    }
  }
  return ctx_local;
}

Assistant:

static void *build_ir_internal(Context *ctx, void *_ast)
{
    if ((_ast == NULL) || (ctx->out_of_memory))
        return NULL;

    MOJOSHADER_astNode *ast = (MOJOSHADER_astNode *) _ast;

    // upkeep so we report correct error locations...
    ctx->sourcefile = ast->ast.filename;
    ctx->sourceline = ast->ast.line;

    switch (ast->ast.type)
    {
        case MOJOSHADER_AST_OP_PREINCREMENT:  // !!! FIXME: sequence points?
            return build_ir_preincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_ADD);

        case MOJOSHADER_AST_OP_POSTINCREMENT: // !!! FIXME: sequence points?
            return build_ir_postincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_ADD);

        case MOJOSHADER_AST_OP_PREDECREMENT:  // !!! FIXME: sequence points?
            return build_ir_preincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_SUBTRACT);

        case MOJOSHADER_AST_OP_POSTDECREMENT: // !!! FIXME: sequence points?
            return build_ir_postincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_SUBTRACT);

        case MOJOSHADER_AST_OP_COMPLEMENT:
            return NEW_IR_BINOP(XOR, build_ir_expr(ctx, ast->unary.operand),
                                new_ir_constint(ctx, 0xFFFFFFFF));

        case MOJOSHADER_AST_OP_NEGATE:  // !!! FIXME: -0.0f != +0.0f
            return NEW_IR_BINOP(SUBTRACT, build_ir_increxpr(ctx, ast->unary.datatype, -1),
                                build_ir_expr(ctx, ast->unary.operand));

        case MOJOSHADER_AST_OP_NOT:  // operand must be bool here!
            assert(ast->unary.operand->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);
            return NEW_IR_BINOP(XOR, build_ir_expr(ctx, ast->unary.operand),
                                new_ir_constint(ctx, 1));

        case MOJOSHADER_AST_OP_DEREF_ARRAY:
            return build_ir_derefarray(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_DEREF_STRUCT:
            if (ast->derefstruct.isswizzle)
                return build_ir_swizzle(ctx, &ast->derefstruct);
            return build_ir_derefstruct(ctx, &ast->derefstruct);

        case MOJOSHADER_AST_OP_COMMA:
            // evaluate and throw away left, return right.
            return new_ir_eseq(ctx, new_ir_expr_stmt(ctx, build_ir_expr(ctx, ast->binary.left)),
                               build_ir_expr(ctx, ast->binary.right));

        case MOJOSHADER_AST_OP_LESSTHAN: return EASY_IR_COMPARE(LT);
        case MOJOSHADER_AST_OP_GREATERTHAN: return EASY_IR_COMPARE(GT);
        case MOJOSHADER_AST_OP_LESSTHANOREQUAL: return EASY_IR_COMPARE(LEQ);
        case MOJOSHADER_AST_OP_GREATERTHANOREQUAL: return EASY_IR_COMPARE(GEQ);
        case MOJOSHADER_AST_OP_NOTEQUAL: return EASY_IR_COMPARE(NEQ);
        case MOJOSHADER_AST_OP_EQUAL: return EASY_IR_COMPARE(EQL);

        case MOJOSHADER_AST_OP_MULTIPLY: return EASY_IR_BINOP(MULTIPLY);
        case MOJOSHADER_AST_OP_DIVIDE: return EASY_IR_BINOP(DIVIDE);
        case MOJOSHADER_AST_OP_MODULO: return EASY_IR_BINOP(MODULO);
        case MOJOSHADER_AST_OP_ADD: return EASY_IR_BINOP(ADD);
        case MOJOSHADER_AST_OP_SUBTRACT: return EASY_IR_BINOP(SUBTRACT);
        case MOJOSHADER_AST_OP_LSHIFT: return EASY_IR_BINOP(LSHIFT);
        case MOJOSHADER_AST_OP_RSHIFT: return EASY_IR_BINOP(RSHIFT);
        case MOJOSHADER_AST_OP_BINARYAND: return EASY_IR_BINOP(AND);
        case MOJOSHADER_AST_OP_BINARYXOR: return EASY_IR_BINOP(XOR);
        case MOJOSHADER_AST_OP_BINARYOR: return EASY_IR_BINOP(OR);

        case MOJOSHADER_AST_OP_LOGICALAND:
            return build_ir_logical_and(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_LOGICALOR:
            return build_ir_logical_or(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_ASSIGN:
            return build_ir_assign(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_MULASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_MULTIPLY, &ast->binary);
        case MOJOSHADER_AST_OP_DIVASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_DIVIDE, &ast->binary);
        case MOJOSHADER_AST_OP_MODASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_MODULO, &ast->binary);
        case MOJOSHADER_AST_OP_ADDASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_ADD, &ast->binary);
        case MOJOSHADER_AST_OP_SUBASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_SUBTRACT, &ast->binary);
        case MOJOSHADER_AST_OP_LSHIFTASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_LSHIFT, &ast->binary);
        case MOJOSHADER_AST_OP_RSHIFTASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_RSHIFT, &ast->binary);
        case MOJOSHADER_AST_OP_ANDASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_AND, &ast->binary);
        case MOJOSHADER_AST_OP_XORASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_XOR, &ast->binary);
        case MOJOSHADER_AST_OP_ORASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_OR, &ast->binary);

        case MOJOSHADER_AST_OP_CONDITIONAL:
            assert(ast->binary.left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);
            return build_ir_compare(ctx, MOJOSHADER_IR_COND_EQL,
                                  build_ir_expr(ctx, ast->ternary.left),
                                  new_ir_constbool(ctx, 1),
                                  build_ir_expr(ctx, ast->ternary.center),
                                  build_ir_expr(ctx, ast->ternary.right));

        case MOJOSHADER_AST_OP_IDENTIFIER:
            return build_ir_identifier(ctx, &ast->identifier);

        case MOJOSHADER_AST_OP_INT_LITERAL:
            return new_ir_constint(ctx, ast->intliteral.value);

        case MOJOSHADER_AST_OP_FLOAT_LITERAL:
            return new_ir_constfloat(ctx, ast->floatliteral.value);

        case MOJOSHADER_AST_OP_BOOLEAN_LITERAL:
            return new_ir_constbool(ctx, ast->boolliteral.value);

        case MOJOSHADER_AST_OP_CALLFUNC:
            return build_ir_call(ctx, &ast->callfunc);

        case MOJOSHADER_AST_OP_CONSTRUCTOR:
            return build_ir_constructor(ctx, &ast->constructor);

        case MOJOSHADER_AST_OP_CAST:
            return build_ir_convert(ctx, &ast->cast);

        case MOJOSHADER_AST_STATEMENT_BREAK:
        {
            const LoopLabels *labels = ctx->ir_loop;
            assert(labels != NULL);  // semantic analysis should catch this.
            return new_ir_jump(ctx, labels->end);
        } // case

        case MOJOSHADER_AST_STATEMENT_CONTINUE:
        {
            const LoopLabels *labels = ctx->ir_loop;
            assert(labels != NULL);  // semantic analysis should catch this.
            return new_ir_jump(ctx, labels->start);
        } // case

        case MOJOSHADER_AST_STATEMENT_DISCARD:
            return new_ir_seq(ctx, new_ir_discard(ctx), build_ir_stmt(ctx, ast->discardstmt.next));

        case MOJOSHADER_AST_STATEMENT_EMPTY:
            return build_ir(ctx, ast->stmt.next);  // skip it, do next thing.

        case MOJOSHADER_AST_STATEMENT_EXPRESSION:
            return new_ir_seq(ctx, new_ir_expr_stmt(ctx, build_ir_expr(ctx, ast->exprstmt.expr)), build_ir_stmt(ctx, ast->exprstmt.next));

        case MOJOSHADER_AST_STATEMENT_IF:
            return build_ir_ifstmt(ctx, &ast->ifstmt);

        case MOJOSHADER_AST_STATEMENT_TYPEDEF:  // ignore this, move on.
            return build_ir(ctx, ast->typedefstmt.next);

        case MOJOSHADER_AST_STATEMENT_SWITCH:
            return build_ir_switch(ctx, &ast->switchstmt);

        case MOJOSHADER_AST_STATEMENT_STRUCT:  // ignore this, move on.
            return build_ir(ctx, ast->structstmt.next);

        case MOJOSHADER_AST_STATEMENT_VARDECL: // ignore this, move on.
            return build_ir(ctx, ast->vardeclstmt.next);

        case MOJOSHADER_AST_STATEMENT_BLOCK:
            return new_ir_seq(ctx, build_ir_stmt(ctx, ast->blockstmt.statements), build_ir_stmt(ctx, ast->blockstmt.next));

        case MOJOSHADER_AST_STATEMENT_FOR:
            return build_ir_forstmt(ctx, &ast->forstmt);

        case MOJOSHADER_AST_STATEMENT_DO:
            return build_ir_dostmt(ctx, &ast->dostmt);

        case MOJOSHADER_AST_STATEMENT_WHILE:
            return build_ir_whilestmt(ctx, &ast->whilestmt);

        case MOJOSHADER_AST_STATEMENT_RETURN:
        {
            const int label = ctx->ir_end;
            assert(label >= 0);  // parser should have caught this!
            MOJOSHADER_irStatement *retval = NULL;
            if (ast->returnstmt.expr != NULL)
            {
                // !!! FIXME: whole array/struct returns need to move more into the temp.
                const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->returnstmt.expr->datatype);
                const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
                const int elems = datatype_elems(ctx, dt);
                assert(ctx->ir_ret >= 0);
                retval = new_ir_move(ctx, new_ir_temp(ctx, ctx->ir_ret, type, elems), build_ir_expr(ctx, ast->returnstmt.expr), -1);
            } // if
            return new_ir_seq(ctx, retval, new_ir_jump(ctx, label));
        } // case

        case MOJOSHADER_AST_COMPUNIT_TYPEDEF:
        case MOJOSHADER_AST_COMPUNIT_STRUCT:
        case MOJOSHADER_AST_COMPUNIT_VARIABLE:
        case MOJOSHADER_AST_COMPUNIT_FUNCTION:
        case MOJOSHADER_AST_ARGUMENTS:
        case MOJOSHADER_AST_OP_STRING_LITERAL:
        case MOJOSHADER_AST_SWITCH_CASE:
        case MOJOSHADER_AST_SCALAR_OR_ARRAY:
        case MOJOSHADER_AST_TYPEDEF:
        case MOJOSHADER_AST_FUNCTION_PARAMS:
        case MOJOSHADER_AST_FUNCTION_SIGNATURE:
        case MOJOSHADER_AST_STRUCT_DECLARATION:
        case MOJOSHADER_AST_STRUCT_MEMBER:
        case MOJOSHADER_AST_VARIABLE_DECLARATION:
        case MOJOSHADER_AST_ANNOTATION:
        case MOJOSHADER_AST_PACK_OFFSET:
        case MOJOSHADER_AST_VARIABLE_LOWLEVEL:
            assert(0 && "Shouldn't hit this in build_ir.");
            return NULL;

        default:
            assert(0 && "unexpected type");
            return NULL;
    } // switch
}